

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::RepeatedPrimitiveFieldGenerator::
RepeatedPrimitiveFieldGenerator
          (RepeatedPrimitiveFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  pointer pcVar1;
  Type field_type;
  ObjectiveCType OVar2;
  LogMessage *other;
  long *plVar3;
  mapped_type *pmVar4;
  size_type *psVar5;
  char *__s;
  string base_name;
  undefined1 local_e0 [56];
  key_type local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  key_type local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  RepeatedFieldGenerator::RepeatedFieldGenerator
            (&this->super_RepeatedFieldGenerator,descriptor,options);
  (this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.super_SingleFieldGenerator.
  super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedPrimitiveFieldGenerator_0042a1f0;
  variables = &(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
               super_SingleFieldGenerator.super_FieldGenerator.variables_;
  anon_unknown_5::SetPrimitiveVariables(descriptor,variables);
  field_type = FieldDescriptor::type(descriptor);
  OVar2 = GetObjectiveCType(field_type);
  if (OVar2 < (OBJECTIVECTYPE_MESSAGE|OBJECTIVECTYPE_UINT32)) {
    __s = &DAT_003a1818 + *(int *)(&DAT_003a1818 + (ulong)OVar2 * 4);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_primitive_field.cc"
               ,0x74);
    other = internal::LogMessage::operator<<((LogMessage *)local_e0,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
    __s = (char *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,__s,(allocator<char> *)local_e0);
  if (local_48._M_string_length == 0) {
    pcVar1 = local_e0 + 0x10;
    local_e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"array_storage_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_e0);
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x3a15a0);
    if ((pointer)local_e0._0_8_ != pcVar1) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"storage_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a8);
    std::operator+(&local_88,"NSMutableArray<",pmVar4);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      local_e0._16_8_ = *psVar5;
      local_e0._24_4_ = (undefined4)plVar3[3];
      local_e0._28_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
      local_e0._0_8_ = pcVar1;
    }
    else {
      local_e0._16_8_ = *psVar5;
      local_e0._0_8_ = (size_type *)*plVar3;
    }
    local_e0._8_8_ = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"array_property_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_68);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_e0._0_8_ != pcVar1) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_88._M_dataplus._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_002b5e11;
  }
  else {
    std::operator+(&local_88,"GPB",&local_48);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      local_e0._16_8_ = *psVar5;
      local_e0._24_4_ = (undefined4)plVar3[3];
      local_e0._28_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
      local_e0._0_8_ = local_e0 + 0x10;
    }
    else {
      local_e0._16_8_ = *psVar5;
      local_e0._0_8_ = (size_type *)*plVar3;
    }
    local_e0._8_8_ = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"array_storage_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    local_a8.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_002b5e11;
  }
  operator_delete(local_88._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
LAB_002b5e11:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : RepeatedFieldGenerator(descriptor, options) {
  SetPrimitiveVariables(descriptor, &variables_);

  string base_name = PrimitiveArrayTypeName(descriptor);
  if (base_name.length()) {
    variables_["array_storage_type"] = "GPB" + base_name + "Array";
  } else {
    variables_["array_storage_type"] = "NSMutableArray";
    variables_["array_property_type"] =
        "NSMutableArray<" + variables_["storage_type"] + "*>";
  }
}